

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UCharCharacterIterator::last32(UCharCharacterIterator *this)

{
  char16_t cVar1;
  char16_t *pcVar2;
  int iVar3;
  uint local_1c;
  uint16_t __c2;
  UChar32 c;
  UCharCharacterIterator *this_local;
  
  (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
  if ((this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos) {
    pcVar2 = this->text;
    iVar3 = (this->super_CharacterIterator).pos + -1;
    (this->super_CharacterIterator).pos = iVar3;
    local_1c = (uint)(ushort)pcVar2[iVar3];
    if ((((local_1c & 0xfffffc00) == 0xdc00) &&
        ((this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos)) &&
       (cVar1 = this->text[(this->super_CharacterIterator).pos + -1], (cVar1 & 0xfc00U) == 0xd800))
    {
      (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + -1;
      local_1c = (uint)(ushort)cVar1 * 0x400 + local_1c + 0xfca02400;
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = 0xffff;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UCharCharacterIterator::last32() {
    pos = end;
    if(pos > begin) {
        UChar32 c;
        U16_PREV(text, begin, pos, c);
        return c;
    } else {
        return DONE;
    }
}